

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_detach_item_via_pointer_should_detach_items(void)

{
  cJSON *pcVar1;
  long in_FS_OFFSET;
  cJSON parent [1];
  cJSON list [4];
  cJSON cStack_168;
  cJSON local_128;
  cJSON local_e8;
  cJSON local_a8;
  cJSON local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_128,0,0x100);
  cStack_168.child = &local_128;
  local_128.next = &local_e8;
  local_e8.next = &local_a8;
  local_e8.prev = &local_128;
  local_a8.next = &local_68;
  local_a8.prev = &local_e8;
  local_68.prev = &local_a8;
  pcVar1 = cJSON_DetachItemViaPointer(&cStack_168,&local_e8);
  if (pcVar1 != &local_e8) {
    UnityFail("Failed to detach in the middle.",0xf0);
  }
  if (local_e8.next != (cJSON *)0x0 || local_e8.prev != (cJSON *)0x0) {
    UnityFail("Didn\'t set pointers of detached item to NULL.",0xf1);
  }
  if ((local_128.next != &local_a8) || (local_a8.prev != &local_128)) {
    UnityFail(" Expected TRUE Was FALSE",0xf2);
  }
  pcVar1 = cJSON_DetachItemViaPointer(&cStack_168,&local_128);
  if (pcVar1 != &local_128) {
    UnityFail("Failed to detach beginning.",0xf5);
  }
  if (local_128.next != (cJSON *)0x0 || local_128.prev != (cJSON *)0x0) {
    UnityFail("Didn\'t set pointers of detached item to NULL.",0xf6);
  }
  if ((local_a8.prev != (cJSON *)0x0) || (cStack_168.child != &local_a8)) {
    UnityFail("Didn\'t set the new beginning.",0xf7);
  }
  pcVar1 = cJSON_DetachItemViaPointer(&cStack_168,&local_68);
  if (pcVar1 != &local_68) {
    UnityFail("Failed to detach end.",0xfa);
  }
  if (local_68.next != (cJSON *)0x0 || local_68.prev != (cJSON *)0x0) {
    UnityFail("Didn\'t set pointers of detached item to NULL.",0xfb);
  }
  if ((local_a8.next != (cJSON *)0x0) || (cStack_168.child != &local_a8)) {
    UnityFail("Didn\'t set the new end",0xfc);
  }
  pcVar1 = cJSON_DetachItemViaPointer(&cStack_168,&local_a8);
  if (pcVar1 != &local_a8) {
    UnityFail("Failed to detach single item.",0xff);
  }
  if (local_a8.next != (cJSON *)0x0 || local_a8.prev != (cJSON *)0x0) {
    UnityFail("Didn\'t set pointers of detached item to NULL.",0x100);
  }
  if (cStack_168.child != (cJSON *)0x0) {
    UnityFail("Child of the parent wasn\'t set to NULL.",0x101);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_detach_item_via_pointer_should_detach_items(void)
{
    cJSON list[4];
    cJSON parent[1];

    memset(list, '\0', sizeof(list));

    /* link the list */
    list[0].next = &(list[1]);
    list[1].next = &(list[2]);
    list[2].next = &(list[3]);

    list[3].prev = &(list[2]);
    list[2].prev = &(list[1]);
    list[1].prev = &(list[0]);

    parent->child = &list[0];

    /* detach in the middle (list[1]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[1])) == &(list[1]), "Failed to detach in the middle.");
    TEST_ASSERT_TRUE_MESSAGE((list[1].prev == NULL) && (list[1].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE((list[0].next == &(list[2])) && (list[2].prev == &(list[0])));

    /* detach beginning (list[0]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[0])) == &(list[0]), "Failed to detach beginning.");
    TEST_ASSERT_TRUE_MESSAGE((list[0].prev == NULL) && (list[0].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].prev == NULL) && (parent->child == &(list[2])), "Didn't set the new beginning.");

    /* detach end (list[3])*/
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[3])) == &(list[3]), "Failed to detach end.");
    TEST_ASSERT_TRUE_MESSAGE((list[3].prev == NULL) && (list[3].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].next == NULL) && (parent->child == &(list[2])), "Didn't set the new end");

    /* detach single item (list[2]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &list[2]) == &list[2], "Failed to detach single item.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].prev == NULL) && (list[2].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_NULL_MESSAGE(parent->child, "Child of the parent wasn't set to NULL.");
}